

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QString> * __thiscall
QList<QString>::mid(QList<QString> *__return_storage_ptr__,QList<QString> *this,qsizetype pos,
                   qsizetype len)

{
  QString *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  CutResult CVar4;
  QString *data;
  QString *pQVar5;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QArrayDataPointer<QString> local_60;
  QArrayDataPointer<QString> local_48;
  longlong local_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = len;
  local_28 = pos;
  CVar4 = QtPrivate::QContainerImplHelper::mid((this->d).size,&local_28,&local_30);
  if (CVar4 < Full) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (CVar4 == Full) {
    pDVar2 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_60.ptr = (QString *)
                   QArrayData::allocate((QArrayData **)&local_48,0x18,0x10,local_30,KeepSize);
    local_60.d = local_48.d;
    local_48.size = 0;
    if (local_30 < 1) {
      local_60.size = 0;
    }
    else {
      pQVar5 = (this->d).ptr + local_28;
      pQVar1 = pQVar5 + local_30;
      do {
        pDVar3 = (pQVar5->d).d;
        local_60.ptr[local_48.size].d.d = pDVar3;
        local_60.ptr[local_48.size].d.ptr = (pQVar5->d).ptr;
        local_60.ptr[local_48.size].d.size = (pQVar5->d).size;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQVar5 = pQVar5 + 1;
        local_60.size = local_48.size + 1;
        local_48.size = local_60.size;
      } while (pQVar5 < pQVar1);
    }
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_48.size = 0;
    (__return_storage_ptr__->d).d = local_60.d;
    (__return_storage_ptr__->d).ptr = local_60.ptr;
    (__return_storage_ptr__->d).size = local_60.size;
    if (local_60.d != (Data *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}